

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O0

void helper_compute_psr_sparc(CPUSPARCState *env)

{
  uint32_t uVar1;
  uint32_t new_psr;
  CPUSPARCState *env_local;
  
  uVar1 = (*icc_table[env->cc_op].compute_all)(env);
  env->psr = uVar1;
  env->cc_op = 1;
  return;
}

Assistant:

void helper_compute_psr(CPUSPARCState *env)
{
    uint32_t new_psr;

    new_psr = icc_table[CC_OP].compute_all(env);
    env->psr = new_psr;
#ifdef TARGET_SPARC64
    new_psr = xcc_table[CC_OP].compute_all(env);
    env->xcc = new_psr;
#endif
    CC_OP = CC_OP_FLAGS;
}